

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O3

void __thiscall UniValue::clear(UniValue *this)

{
  pointer pUVar1;
  pointer pUVar2;
  pointer this_00;
  
  this->typ = VNULL;
  (this->val)._M_string_length = 0;
  *(this->val)._M_dataplus._M_p = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->keys);
  pUVar1 = (this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
  pUVar2 = (this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = pUVar1;
  if (pUVar2 != pUVar1) {
    do {
      ~UniValue(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pUVar2);
    (this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = pUVar1;
  }
  return;
}

Assistant:

void UniValue::clear()
{
    typ = VNULL;
    val.clear();
    keys.clear();
    values.clear();
}